

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O3

void sf2cute::RIFFListChunk::WriteHeader(ostream *out,string *name,size_type size)

{
  long lVar1;
  ostream *poVar2;
  length_error *this;
  ostringstream message_builder;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  if (size >> 0x20 == 0) {
    lVar1 = *(long *)(*(long *)out + -0x18);
    *(undefined4 *)(out + lVar1 + 0x1c) = 5;
    std::ios::clear((int)out + (int)lVar1);
    std::ostream::write((char *)out,0x1154c1);
    InsertInt32L<std::ostream>(out,(uint32_t)size);
    std::ostream::write((char *)out,(long)(name->_M_dataplus)._M_p);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"RIFF chunk \"",0xc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" size too large.",0x11);
  this = (length_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::length_error::length_error(this,asStack_1b8);
  __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void RIFFListChunk::WriteHeader(std::ostream & out,
    const std::string & name,
    size_type size) {
  // Throw exception if the chunk size exceeds the maximum.
  if (size > UINT32_MAX) {
    std::ostringstream message_builder;
    message_builder << "RIFF chunk \"" << name << "\" size too large.";
    throw std::length_error(message_builder.str());
  }

  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk ID "LIST".
    out.write("LIST", 4);

    // Write the chunk size.
    InsertInt32L(out, static_cast<uint32_t>(size));

    // Write the list type.
    out.write(name.data(), name.size());
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}